

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceGet(ze_driver_handle_t hDriver,uint32_t *pCount,ze_device_handle_t *phDevices)

{
  ze_device_handle_t p_Var1;
  bool bVar2;
  ulong local_38;
  size_t i;
  ze_pfnDeviceGet_t pfnGet;
  ze_result_t result;
  ze_device_handle_t *phDevices_local;
  uint32_t *pCount_local;
  ze_driver_handle_t hDriver_local;
  
  pfnGet._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c218 == (code *)0x0) {
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (phDevices != (ze_device_handle_t *)0x0) {
        bVar2 = local_38 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (ze_device_handle_t)context_t::get((context_t *)&context);
      phDevices[local_38] = p_Var1;
      local_38 = local_38 + 1;
    }
  }
  else {
    pfnGet._4_4_ = (*DAT_0011c218)(hDriver,pCount,phDevices);
  }
  return pfnGet._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGet(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of devices available.
                                                        ///< if count is greater than the number of devices available, then the
                                                        ///< driver shall update the value with the correct number of devices available.
        ze_device_handle_t* phDevices                   ///< [in,out][optional][range(0, *pCount)] array of handle of devices.
                                                        ///< if count is less than the number of devices available, then driver
                                                        ///< shall only retrieve that number of devices.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGet = context.zeDdiTable.Device.pfnGet;
        if( nullptr != pfnGet )
        {
            result = pfnGet( hDriver, pCount, phDevices );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phDevices ) && ( i < *pCount ); ++i )
                phDevices[ i ] = reinterpret_cast<ze_device_handle_t>( context.get() );

        }

        return result;
    }